

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBAddRow_C(uint8_t *src_argb0,uint8_t *src_argb1,uint8_t *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  int32_t iVar7;
  int in_ECX;
  undefined1 *in_RDX;
  byte *in_RSI;
  byte *in_RDI;
  int a_add;
  int r_add;
  int g_add;
  int b_add;
  int a;
  int r;
  int g;
  int b;
  int i;
  int local_20;
  undefined1 *local_18;
  byte *local_10;
  byte *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_20 = 0; local_20 < in_ECX; local_20 = local_20 + 1) {
    bVar1 = local_8[1];
    bVar2 = local_8[2];
    bVar3 = local_8[3];
    bVar4 = local_10[1];
    bVar5 = local_10[2];
    bVar6 = local_10[3];
    iVar7 = libyuv::clamp255((uint)*local_10 + (uint)*local_8);
    *local_18 = (char)iVar7;
    iVar7 = libyuv::clamp255((uint)bVar4 + (uint)bVar1);
    local_18[1] = (char)iVar7;
    iVar7 = libyuv::clamp255((uint)bVar5 + (uint)bVar2);
    local_18[2] = (char)iVar7;
    iVar7 = libyuv::clamp255((uint)bVar6 + (uint)bVar3);
    local_18[3] = (char)iVar7;
    local_8 = local_8 + 4;
    local_10 = local_10 + 4;
    local_18 = local_18 + 4;
  }
  return;
}

Assistant:

void ARGBAddRow_C(const uint8_t* src_argb0,
                  const uint8_t* src_argb1,
                  uint8_t* dst_argb,
                  int width) {
  int i;
  for (i = 0; i < width; ++i) {
    const int b = src_argb0[0];
    const int g = src_argb0[1];
    const int r = src_argb0[2];
    const int a = src_argb0[3];
    const int b_add = src_argb1[0];
    const int g_add = src_argb1[1];
    const int r_add = src_argb1[2];
    const int a_add = src_argb1[3];
    dst_argb[0] = SHADE(b, b_add);
    dst_argb[1] = SHADE(g, g_add);
    dst_argb[2] = SHADE(r, r_add);
    dst_argb[3] = SHADE(a, a_add);
    src_argb0 += 4;
    src_argb1 += 4;
    dst_argb += 4;
  }
}